

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall Model::RegisterTranscript(Model *this,Ptr *transcript)

{
  element_type *peVar1;
  SpeciesTracker *inst;
  Ptr local_28;
  
  local_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((transcript->super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_Polymer;
  local_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (transcript->super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  RegisterPolymer(this,&local_28);
  if (local_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  peVar1 = (transcript->super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  inst = SpeciesTracker::Instance();
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::ConnectMember<SpeciesTracker>(&(peVar1->super_Polymer).termination_signal_,inst,0x1245ea);
  if (this->initialized_ == false) {
    std::vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>::
    push_back(&this->transcripts_,transcript);
  }
  return;
}

Assistant:

void Model::RegisterTranscript(Transcript::Ptr transcript) {
  RegisterPolymer(transcript);
  transcript->termination_signal_.ConnectMember(
      &SpeciesTracker::Instance(), &SpeciesTracker::TerminateTranslation);
  if (initialized_ == false) {
    transcripts_.push_back(transcript);
  }
}